

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vacuum.cpp
# Opt level: O3

void __thiscall wasm::Vacuum::visitBlock(Vacuum *this,Block *curr)

{
  size_t sVar1;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_00;
  bool bVar2;
  Expression *to;
  Type *pTVar3;
  ulong uVar4;
  Expression *pEVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  size_t sVar10;
  ulong uVar11;
  Type local_98;
  size_t local_90;
  Type *local_88;
  ExpressionStack *local_80;
  Type local_78;
  undefined1 local_70 [8];
  Iterator __begin3;
  Type local_50;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *local_48;
  TypeUpdater *local_40;
  Block *local_38;
  
  sVar1 = (curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          usedElements;
  if (sVar1 != 0) {
    local_48 = &(curr->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>;
    local_80 = &(this->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
                expressionStack;
    local_40 = &this->typeUpdater;
    sVar10 = 0;
    iVar7 = 2;
    uVar11 = 0;
    local_90 = sVar1;
    local_38 = curr;
    do {
      if ((local_38->list).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements <=
          uVar11) goto LAB_0093380d;
      pEVar5 = ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
               &local_48->data)->data[uVar11];
      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = sVar10;
      if ((uVar11 == sVar1 - 1) &&
         (1 < (local_38->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id
         )) {
        bVar2 = ExpressionAnalyzer::isResultUsed
                          (local_80,(this->
                                    super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                                    ).
                                    super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                                    .
                                    super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                                    .super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
                                    currFunction);
      }
      else {
        bVar2 = false;
      }
      to = optimize(this,pEVar5,bVar2,true);
      if (to == (Expression *)0x0) {
        uVar4 = (pEVar5->type).id;
        if (uVar4 < 2) {
          if (uVar4 != 1) goto LAB_00933737;
          goto LAB_009335ef;
        }
        local_78.id = uVar4;
        local_50.id = uVar4;
        bVar2 = wasm::Type::isNonNullable(&local_50);
        to = pEVar5;
        if (!bVar2) {
          bVar2 = wasm::Type::isTuple(&local_50);
          if (bVar2) {
            local_70 = (undefined1  [8])&local_50;
            __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                 (Type *)0x0;
            local_88 = (Type *)wasm::Type::size((Type *)local_70);
            if (local_88 != (Type *)0x0) {
              do {
                pTVar3 = wasm::Type::Iterator::operator*((Iterator *)local_70);
                local_98.id = pTVar3->id;
                bVar2 = wasm::Type::isNonNullable(&local_98);
                if (bVar2) goto LAB_0093372a;
                __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                     = (Type *)((long)&(__begin3.
                                        super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                       .parent)->id + 1);
              } while ((__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                        .parent != local_88) || (local_70 != (undefined1  [8])&local_50));
            }
          }
          to = LiteralUtils::makeZero
                         (local_78,(this->
                                   super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                                   ).
                                   super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                                   .
                                   super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                                   .super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
                                   currModule);
        }
LAB_0093372a:
        if (to != (Expression *)0x0) goto LAB_009335c0;
LAB_00933737:
        TypeUpdater::noteRecursiveRemoval(local_40,pEVar5);
        sVar10 = (size_t)((int)__begin3.
                               super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               index + 1);
      }
      else {
LAB_009335c0:
        if (to != pEVar5) {
          TypeUpdater::noteReplacement(local_40,pEVar5,to,false);
          if ((local_38->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements <= uVar11) goto LAB_0093380d;
          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)&local_48->data)
          ->data[uVar11] = to;
        }
LAB_009335ef:
        this_00 = local_48;
        uVar4 = (local_38->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                usedElements;
        iVar9 = (int)__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     index;
        if (0 < iVar9) {
          if ((uVar4 <= uVar11) ||
             (uVar6 = uVar11 - (__begin3.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                                index & 0xffffffff), uVar4 <= uVar6)) goto LAB_0093380d;
          local_48->data[uVar6] = local_48->data[uVar11];
          local_48->data[uVar11] = (Expression *)0x0;
        }
        uVar6 = uVar11 - (long)iVar9;
        if (uVar4 <= uVar6) {
LAB_0093380d:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        sVar10 = __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
        if ((uVar11 < sVar1 - 1) && ((local_48->data[uVar6]->type).id == 1)) {
          uVar11 = uVar6 + 1 & 0xffffffff;
          if (uVar11 < uVar4) {
            uVar8 = iVar7 - iVar9;
            do {
              pEVar5 = this_00->data[uVar11];
              if (pEVar5 != (Expression *)0x0) {
                TypeUpdater::noteRecursiveRemoval(local_40,pEVar5);
                uVar4 = (local_38->list).
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                        usedElements;
              }
              uVar11 = (ulong)uVar8;
              uVar8 = uVar8 + 1;
            } while (uVar11 < uVar4);
          }
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
                    (this_00,uVar6 + 1);
          curr = local_38;
          TypeUpdater::maybeUpdateTypeToUnreachable(local_40,local_38);
          goto LAB_009337e6;
        }
      }
      uVar11 = uVar11 + 1;
      iVar7 = iVar7 + 1;
    } while (uVar11 != local_90);
    curr = local_38;
    if (0 < (int)sVar10) {
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
                (local_48,local_90 - (sVar10 & 0xffffffff));
      TypeUpdater::maybeUpdateTypeToUnreachable(local_40,local_38);
      curr = local_38;
    }
  }
LAB_009337e6:
  pEVar5 = BlockUtils::simplifyToContents<wasm::Vacuum>(curr,this,false);
  replaceCurrent(this,pEVar5);
  return;
}

Assistant:

void visitBlock(Block* curr) {
    // compress out nops and other dead code
    int skip = 0;
    auto& list = curr->list;
    size_t size = list.size();
    for (size_t z = 0; z < size; z++) {
      auto* child = list[z];
      // The last element may be used.
      bool used =
        z == size - 1 && curr->type.isConcrete() &&
        ExpressionAnalyzer::isResultUsed(expressionStack, getFunction());
      auto* optimized = optimize(child, used, true);
      if (!optimized) {
        auto childType = child->type;
        if (childType.isConcrete()) {
          if (LiteralUtils::canMakeZero(childType)) {
            // We can't just skip a final concrete element, even if it isn't
            // used. Instead, replace it with something that's easy to optimize
            // out (for example, code-folding can merge out identical zeros at
            // the end of if arms).
            optimized = LiteralUtils::makeZero(childType, *getModule());
          } else {
            // Don't optimize it out.
            optimized = child;
          }
        } else if (childType == Type::unreachable) {
          // Don't try to optimize out an unreachable child (dce can do that
          // properly).
          optimized = child;
        }
      }
      if (!optimized) {
        typeUpdater.noteRecursiveRemoval(child);
        skip++;
      } else {
        if (optimized != child) {
          typeUpdater.noteReplacement(child, optimized);
          list[z] = optimized;
        }
        if (skip > 0) {
          list[z - skip] = list[z];
          list[z] = nullptr;
        }
        // if this is unreachable, the rest is dead code
        if (list[z - skip]->type == Type::unreachable && z < size - 1) {
          for (Index i = z - skip + 1; i < list.size(); i++) {
            auto* remove = list[i];
            if (remove) {
              typeUpdater.noteRecursiveRemoval(remove);
            }
          }
          list.resize(z - skip + 1);
          typeUpdater.maybeUpdateTypeToUnreachable(curr);
          skip = 0; // nothing more to do on the list
          break;
        }
      }
    }
    if (skip > 0) {
      list.resize(size - skip);
      typeUpdater.maybeUpdateTypeToUnreachable(curr);
    }
    // the block may now be a trivial one that we can get rid of and just leave
    // its contents
    replaceCurrent(BlockUtils::simplifyToContents(curr, this));
  }